

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O0

CloudNode * Cloud_bddXor(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  CloudNode *f_00;
  CloudNode *g_00;
  CloudNode *r;
  CloudNode *t1;
  CloudNode *t0;
  CloudNode *g_local;
  CloudNode *f_local;
  CloudManager *dd_local;
  
  if ((((ulong)f & 0xfffffffffffffffe) == 0) || (((ulong)g & 0xfffffffffffffffe) == 0)) {
    dd_local = (CloudManager *)0x0;
  }
  else {
    if ((f < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= f)) {
      __assert_fail("(f) >= dd->tUnique && (f) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                    ,0x21d,"CloudNode *Cloud_bddXor(CloudManager *, CloudNode *, CloudNode *)");
    }
    if ((g < dd->tUnique) || (dd->tUnique + dd->nNodesAlloc <= g)) {
      __assert_fail("(g) >= dd->tUnique && (g) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                    ,0x21e,"CloudNode *Cloud_bddXor(CloudManager *, CloudNode *, CloudNode *)");
    }
    if (dd->tCaches[0] == (CloudCacheEntry2 *)0x0) {
      cloudCacheAllocate(dd,CLOUD_OPER_AND);
    }
    f_00 = cloudBddAnd_gate(dd,f,(CloudNode *)((ulong)g ^ 1));
    if (f_00 == (CloudNode *)0x0) {
      dd_local = (CloudManager *)0x0;
    }
    else {
      g_00 = cloudBddAnd_gate(dd,(CloudNode *)((ulong)f ^ 1),g);
      if (g_00 == (CloudNode *)0x0) {
        dd_local = (CloudManager *)0x0;
      }
      else {
        dd_local = (CloudManager *)Cloud_bddOr(dd,f_00,g_00);
      }
    }
  }
  return (CloudNode *)dd_local;
}

Assistant:

CloudNode * Cloud_bddXor( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    CloudNode * t0, * t1, * r;
    if ( Cloud_Regular(f) == NULL || Cloud_Regular(g) == NULL )
        return NULL;
    CLOUD_ASSERT(f);
    CLOUD_ASSERT(g);
    if ( dd->tCaches[CLOUD_OPER_AND] == NULL )
        cloudCacheAllocate( dd, CLOUD_OPER_AND );
    t0 = cloudBddAnd_gate( dd, f, Cloud_Not(g) );
    if ( t0 == NULL )
        return NULL;
    t1 = cloudBddAnd_gate( dd, Cloud_Not(f), g );
    if ( t1 == NULL )
        return NULL;
    r  = Cloud_bddOr( dd, t0, t1 );
    return r;
}